

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprIsInteger(Expr *p,int *pValue,Parse *pParse)

{
  u32 *puVar1;
  u8 uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  sqlite3_value *pMem;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  int v;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (p == (Expr *)0x0) {
LAB_0017c952:
    iVar5 = 0;
  }
  else {
    while ((p->flags & 0x800) == 0) {
      uVar2 = p->op;
      if (uVar2 != 0xad) {
        if (uVar2 == 0x9d) {
          if (((pParse == (Parse *)0x0) || (pParse->pVdbe == (Vdbe *)0x0)) ||
             ((pParse->db->flags & 0x800000) != 0)) goto LAB_0017c952;
          sVar3 = p->iColumn;
          uVar8 = 1 << ((char)sVar3 - 1U & 0x1f);
          uVar7 = 0x80000000;
          if (sVar3 < 0x20) {
            uVar7 = uVar8;
          }
          puVar1 = &pParse->pVdbe->expmask;
          *puVar1 = *puVar1 | uVar7;
          pMem = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar3,(u8)uVar8);
          iVar5 = 0;
          if (pMem != (sqlite3_value *)0x0) {
            uVar7._0_2_ = pMem->flags;
            uVar7._2_1_ = pMem->enc;
            uVar7._3_1_ = pMem->eSubtype;
            iVar5 = 0;
            if (((0x50505050UL >> ((ulong)uVar7 & 0x3f) & 1) != 0) &&
               (uVar6 = sqlite3VdbeIntValue(pMem), uVar6 < 0x80000000)) {
              *pValue = (int)uVar6;
              iVar5 = 1;
            }
            sqlite3ValueFree(pMem);
          }
        }
        else {
          iVar5 = 0;
          if (uVar2 == 0xae) {
            local_24 = 0;
            iVar5 = 0;
            iVar4 = sqlite3ExprIsInteger(p->pLeft,&local_24,(Parse *)0x0);
            if (iVar4 != 0) {
              iVar5 = -local_24;
              goto LAB_0017c8c4;
            }
          }
        }
        goto LAB_0017c954;
      }
      p = p->pLeft;
      pParse = (Parse *)0x0;
      iVar5 = 0;
      if (p == (Expr *)0x0) goto LAB_0017c954;
    }
    iVar5 = (p->u).iValue;
LAB_0017c8c4:
    *pValue = iVar5;
    iVar5 = 1;
  }
LAB_0017c954:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsInteger(const Expr *p, int *pValue, Parse *pParse){
  int rc = 0;
  if( NEVER(p==0) ) return 0;  /* Used to only happen following on OOM */

  /* If an expression is an integer literal that fits in a signed 32-bit
  ** integer, then the EP_IntValue flag will have already been set */
  assert( p->op!=TK_INTEGER || (p->flags & EP_IntValue)!=0
           || sqlite3GetInt32(p->u.zToken, &rc)==0 );

  if( p->flags & EP_IntValue ){
    *pValue = p->u.iValue;
    return 1;
  }
  switch( p->op ){
    case TK_UPLUS: {
      rc = sqlite3ExprIsInteger(p->pLeft, pValue, 0);
      break;
    }
    case TK_UMINUS: {
      int v = 0;
      if( sqlite3ExprIsInteger(p->pLeft, &v, 0) ){
        assert( ((unsigned int)v)!=0x80000000 );
        *pValue = -v;
        rc = 1;
      }
      break;
    }
    case TK_VARIABLE: {
      sqlite3_value *pVal;
      if( pParse==0 ) break;
      if( NEVER(pParse->pVdbe==0) ) break;
      if( (pParse->db->flags & SQLITE_EnableQPSG)!=0 ) break;
      sqlite3VdbeSetVarmask(pParse->pVdbe, p->iColumn);
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare, p->iColumn,
                                      SQLITE_AFF_BLOB);
      if( pVal ){
        if( sqlite3_value_type(pVal)==SQLITE_INTEGER ){
          sqlite3_int64 vv = sqlite3_value_int64(pVal);
          if( vv == (vv & 0x7fffffff) ){ /* non-negative numbers only */
            *pValue = (int)vv;
            rc = 1;
          }
        }
        sqlite3ValueFree(pVal);
      }
      break;
    }
    default: break;
  }
  return rc;
}